

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint16_t parseNumber(char **string,char *errPrefix,uint16_t errVal)

{
  uint8_t uVar1;
  byte bVar2;
  char *pcVar3;
  ushort local_32;
  uint8_t index;
  anon_class_8_1_8989b3cf aStack_30;
  uint16_t number;
  anon_class_8_1_8989b3cf charIndex;
  uint8_t base;
  uint16_t errVal_local;
  char *errPrefix_local;
  char **string_local;
  
  charIndex.base._5_1_ = 10;
  charIndex.base._6_2_ = errVal;
  if (**string == '\0') {
    error("%s: expected number, but found nothing",errPrefix);
    string_local._6_2_ = charIndex.base._6_2_;
  }
  else {
    if (**string == '$') {
      charIndex.base._5_1_ = 0x10;
      *string = *string + 1;
    }
    else if (**string == '%') {
      charIndex.base._5_1_ = 2;
      *string = *string + 1;
    }
    else if ((**string == '0') && ((*string)[1] != '\0')) {
      if (((*string)[1] == 'x') || ((*string)[1] == 'X')) {
        charIndex.base._5_1_ = 0x10;
        *string = *string + 2;
      }
      else if (((*string)[1] == 'b') || ((*string)[1] == 'B')) {
        charIndex.base._5_1_ = 2;
        *string = *string + 2;
      }
    }
    aStack_30.base = (uint8_t *)((long)&charIndex.base + 5);
    uVar1 = parseNumber::anon_class_8_1_8989b3cf::operator()(&stack0xffffffffffffffd0,**string);
    if (uVar1 == 0xff) {
      pcVar3 = "";
      if (charIndex.base._5_1_ != 10) {
        pcVar3 = " after base";
      }
      error("%s: expected digit%s, but found nothing",errPrefix,pcVar3);
      string_local._6_2_ = charIndex.base._6_2_;
    }
    else {
      local_32 = 0;
      do {
        bVar2 = parseNumber::anon_class_8_1_8989b3cf::operator()(&stack0xffffffffffffffd0,**string);
        if (bVar2 == 0xff) break;
        *string = *string + 1;
        local_32 = local_32 * charIndex.base._5_1_ + (ushort)bVar2;
        if ((uint)(0xffff / (ulong)(long)(int)(uint)charIndex.base._5_1_) <= (uint)local_32) {
          error("%s: the number is too large!",errPrefix,
                0xffff % (ulong)(long)(int)(uint)charIndex.base._5_1_);
          return charIndex.base._6_2_;
        }
      } while (**string != '\0');
      string_local._6_2_ = local_32;
    }
  }
  return string_local._6_2_;
}

Assistant:

static uint16_t parseNumber(char *&string, char const *errPrefix, uint16_t errVal = UINT16_MAX) {
	uint8_t base = 10;
	if (*string == '\0') {
		error("%s: expected number, but found nothing", errPrefix);
		return errVal;
	} else if (*string == '$') {
		base = 16;
		++string;
	} else if (*string == '%') {
		base = 2;
		++string;
	} else if (*string == '0' && string[1] != '\0') {
		// Check if we have a "0x" or "0b" here
		if (string[1] == 'x' || string[1] == 'X') {
			base = 16;
			string += 2;
		} else if (string[1] == 'b' || string[1] == 'B') {
			base = 2;
			string += 2;
		}
	}

	/*
	 * Turns a digit into its numeric value in the current base, if it has one.
	 * Maximum is inclusive. The string_view is modified to "consume" all digits.
	 * Returns 255 on parse failure (including wrong char for base), in which case
	 * the string_view may be pointing on garbage.
	 */
	auto charIndex = [&base](unsigned char c) -> uint8_t {
		unsigned char index = c - '0'; // Use wrapping semantics
		if (base == 2 && index >= 2) {
			return 255;
		} else if (index < 10) {
			return index;
		} else if (base != 16) {
			return 255; // Letters are only valid in hex
		}
		index = tolower(c) - 'a'; // OK because we pass an `unsigned char`
		if (index < 6) {
			return index + 10;
		}
		return 255;
	};

	if (charIndex(*string) == 255) {
		error("%s: expected digit%s, but found nothing", errPrefix,
		      base != 10 ? " after base" : "");
		return errVal;
	}
	uint16_t number = 0;
	do {
		// Read a character, and check if it's valid in the given base
		uint8_t index = charIndex(*string);
		if (index == 255) {
			break; // Found an invalid character, end
		}
		++string;

		number *= base;
		number += index;
		// The lax check covers the addition on top of the multiplication
		if (number >= UINT16_MAX / base) {
			error("%s: the number is too large!", errPrefix);
			return errVal;
		}
	} while (*string != '\0'); // No more characters?

	return number;
}